

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

void __thiscall ipx::Model::LoadPrimal(Model *this)

{
  char cVar1;
  double *pdVar2;
  double *__result;
  reference pvVar3;
  undefined1 *in_RDI;
  SparseMatrix *unaff_retaddr;
  Int i_1;
  Int i;
  SparseMatrix *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  size_t in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 uVar4;
  double *in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc4;
  int __n;
  double *in_stack_ffffffffffffffc8;
  int local_1c;
  int local_c;
  
  *(undefined4 *)(in_RDI + 4) = *(undefined4 *)(in_RDI + 0x168);
  *(undefined4 *)(in_RDI + 8) = *(undefined4 *)(in_RDI + 0x170);
  *in_RDI = 0;
  SparseMatrix::operator=
            ((SparseMatrix *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             in_stack_ffffffffffffff98);
  for (local_c = 0; local_c < *(int *)(in_RDI + 0x168); local_c = local_c + 1) {
    SparseMatrix::push_back
              ((SparseMatrix *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               (Int)(in_stack_ffffffffffffffa8 >> 0x20),
               (double)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    SparseMatrix::add_column(unaff_retaddr);
  }
  std::valarray<double>::operator=
            ((valarray<double> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             (valarray<double> *)in_stack_ffffffffffffff98);
  std::valarray<double>::resize
            ((valarray<double> *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             in_stack_ffffffffffffffa8,
             (double)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  std::valarray<double>::operator=
            ((valarray<double> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             (double *)in_stack_ffffffffffffff98);
  pdVar2 = std::begin<double>((valarray<double> *)
                              CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  uVar4 = *(undefined4 *)(in_RDI + 0x170);
  std::begin<double>((valarray<double> *)
                     CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  std::copy_n<double*,int,double*>
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,in_stack_ffffffffffffffb8);
  std::valarray<double>::resize
            ((valarray<double> *)CONCAT44(uVar4,in_stack_ffffffffffffffb0),(size_t)pdVar2,
             (double)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  __result = std::begin<double>((valarray<double> *)
                                CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  __n = *(int *)(in_RDI + 0x170);
  std::begin<double>((valarray<double> *)
                     CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  std::copy_n<double*,int,double*>(in_stack_ffffffffffffffc8,__n,__result);
  std::valarray<double>::resize
            ((valarray<double> *)CONCAT44(uVar4,in_stack_ffffffffffffffb0),(size_t)pdVar2,
             (double)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  pdVar2 = std::begin<double>((valarray<double> *)
                              CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  std::begin<double>((valarray<double> *)
                     CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  std::copy_n<double*,int,double*>(pdVar2,__n,__result);
  for (local_1c = 0; local_1c < *(int *)(in_RDI + 0x168); local_1c = local_1c + 1) {
    pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x198),(long)local_1c);
    cVar1 = *pvVar3;
    if (cVar1 == '<') {
      pdVar2 = std::valarray<double>::operator[]
                         ((valarray<double> *)(in_RDI + 0x138),
                          (long)(*(int *)(in_RDI + 0x170) + local_1c));
      *pdVar2 = 0.0;
      pdVar2 = std::valarray<double>::operator[]
                         ((valarray<double> *)(in_RDI + 0x148),
                          (long)(*(int *)(in_RDI + 0x170) + local_1c));
      *pdVar2 = INFINITY;
    }
    else if (cVar1 == '=') {
      pdVar2 = std::valarray<double>::operator[]
                         ((valarray<double> *)(in_RDI + 0x138),
                          (long)(*(int *)(in_RDI + 0x170) + local_1c));
      *pdVar2 = 0.0;
      pdVar2 = std::valarray<double>::operator[]
                         ((valarray<double> *)(in_RDI + 0x148),
                          (long)(*(int *)(in_RDI + 0x170) + local_1c));
      *pdVar2 = 0.0;
    }
    else if (cVar1 == '>') {
      pdVar2 = std::valarray<double>::operator[]
                         ((valarray<double> *)(in_RDI + 0x138),
                          (long)(*(int *)(in_RDI + 0x170) + local_1c));
      *pdVar2 = -INFINITY;
      pdVar2 = std::valarray<double>::operator[]
                         ((valarray<double> *)(in_RDI + 0x148),
                          (long)(*(int *)(in_RDI + 0x170) + local_1c));
      *pdVar2 = 0.0;
    }
  }
  return;
}

Assistant:

void Model::LoadPrimal() {
    num_rows_ = num_constr_;
    num_cols_ = num_var_;
    dualized_ = false;

    // Copy A and append identity matrix.
    AI_ = A_;
    for (Int i = 0; i < num_constr_; i++) {
        AI_.push_back(i, 1.0);
        AI_.add_column();
    }
    assert(AI_.cols() == num_var_+num_constr_);

    // Copy vectors and set bounds on slack variables.
    b_ = scaled_rhs_;
    c_.resize(num_var_+num_constr_);
    c_ = 0.0;
    std::copy_n(std::begin(scaled_obj_), num_var_, std::begin(c_));
    lb_.resize(num_rows_+num_cols_);
    std::copy_n(std::begin(scaled_lbuser_), num_var_, std::begin(lb_));
    ub_.resize(num_rows_+num_cols_);
    std::copy_n(std::begin(scaled_ubuser_), num_var_, std::begin(ub_));
    for (Int i = 0; i < num_constr_; i++) {
        switch(constr_type_[i]) {
        case '=':
            lb_[num_var_+i] = 0.0;
            ub_[num_var_+i] = 0.0;
            break;
        case '<':
            lb_[num_var_+i] = 0.0;
            ub_[num_var_+i] = INFINITY;
            break;
        case '>':
            lb_[num_var_+i] = -INFINITY;
            ub_[num_var_+i] = 0.0;
            break;
        }
    }
}